

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall Js::ProbeContainer::UpdateStep(ProbeContainer *this,bool fDuringSetupDebugApp)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->debugManager == (DebugManager *)0x0) {
    return;
  }
  if ((!fDuringSetupDebugApp) &&
     ((this->pScriptContext == (ScriptContext *)0x0 ||
      (bVar2 = ScriptContext::IsScriptContextInDebugMode(this->pScriptContext), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x275,
                                "(fDuringSetupDebugApp || (pScriptContext && pScriptContext->IsScriptContextInDebugMode()))"
                                ,"Why UpdateStep when we are not in debug mode?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->debugManager->stepController).stepType = STEP_IN;
  return;
}

Assistant:

void ProbeContainer::UpdateStep(bool fDuringSetupDebugApp/*= false*/)
    {
        // This function indicate that when the page is being refreshed and the last action we have done was stepping.
        // so update the state of the current stepController.
        if (debugManager)
        {
            // Usually we need to be in debug mode to UpdateStep. But during setting up new engine to debug mode we have an
            // ordering issue and the new engine will enter debug mode after this. So allow non-debug mode if fDuringSetupDebugApp.
            AssertMsg(fDuringSetupDebugApp || (pScriptContext && pScriptContext->IsScriptContextInDebugMode()), "Why UpdateStep when we are not in debug mode?");
            debugManager->stepController.stepType = STEP_IN;
        }
    }